

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

BOOL __thiscall
Js::GlobalObject::GetRootPropertyReference
          (GlobalObject *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  BOOL BVar1;
  RecyclableObject **ppRVar2;
  HostObjectBase **ppHVar3;
  bool local_4a;
  bool local_49;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  PropertyId propertyId_local;
  Var originalInstance_local;
  GlobalObject *this_local;
  
  BVar1 = RootObjectBase::GetRootPropertyReference
                    (&this->super_RootObjectBase,originalInstance,propertyId,value,info,
                     requestContext);
  if (BVar1 != 0) {
    return 1;
  }
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->directHostObject);
  if (*ppRVar2 != (RecyclableObject *)0x0) {
    ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->directHostObject);
    BVar1 = Js::JavascriptOperators::GetPropertyReference
                      (*ppRVar2,propertyId,value,requestContext,info);
    local_49 = true;
    if (BVar1 != 0) goto LAB_01090a71;
  }
  ppHVar3 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                      ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
  local_4a = false;
  if (*ppHVar3 != (HostObjectBase *)0x0) {
    ppHVar3 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                        ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
    BVar1 = Js::JavascriptOperators::GetPropertyReference
                      ((RecyclableObject *)*ppHVar3,propertyId,value,requestContext,info);
    local_4a = BVar1 != 0;
  }
  local_49 = local_4a;
LAB_01090a71:
  return (uint)local_49;
}

Assistant:

BOOL GlobalObject::GetRootPropertyReference(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info,
        ScriptContext* requestContext)
    {
        if (__super::GetRootPropertyReference(originalInstance, propertyId, value, info, requestContext))
        {
            return true;
        }
        return (this->directHostObject && JavascriptOperators::GetPropertyReference(this->directHostObject, propertyId, value, requestContext, info)) ||
            (this->hostObject && JavascriptOperators::GetPropertyReference(this->hostObject, propertyId, value, requestContext, info));
    }